

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall
AmpIO::GetCollectionStatus(AmpIO *this,bool *collecting,uchar *chan,unsigned_short *writeAddr)

{
  byte bVar1;
  uint32_t uVar2;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if ((6 < uVar2) && (uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this), uVar2 != 0x44514c41)) {
    bVar1 = (byte)(this->ReadBuffer[3] >> 0x18);
    *collecting = (bool)(bVar1 >> 7);
    *chan = bVar1 >> 2 & 0xf;
    *writeAddr = *(ushort *)((long)this->ReadBuffer + 0xe) & 0x3ff;
    return true;
  }
  return false;
}

Assistant:

bool AmpIO::GetCollectionStatus(bool &collecting, unsigned char &chan, unsigned short &writeAddr) const
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == DQLA_String)
        return false;

    collecting = (ReadBuffer[TEMP_OFFSET]&0x80000000);
    chan = (ReadBuffer[TEMP_OFFSET]&0x3c000000)>>26;
    writeAddr = (ReadBuffer[TEMP_OFFSET]&0x03ff0000)>>16;;
    return true;
}